

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O0

void __thiscall
TPZCompElHDiv<pzshape::TPZShapeTriang>::SetSideOrder
          (TPZCompElHDiv<pzshape::TPZShapeTriang> *this,int side,int order)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  void *this_00;
  TPZConnect *this_01;
  long *plVar4;
  TPZBlock *this_02;
  TPZCompMesh *this_03;
  int in_EDX;
  int in_ESI;
  long *in_RDI;
  int nshape;
  TPZMaterial *mat;
  int nvar;
  int64_t seqnum;
  TPZConnect *c;
  int connectaux;
  TPZCompEl *in_stack_00000190;
  TPZConnect *this_04;
  int nstate;
  int iVar5;
  int pos;
  int in_stack_ffffffffffffffd0;
  int b;
  
  iVar1 = (**(code **)(*in_RDI + 0x250))(in_RDI,0,in_ESI);
  if ((-1 < iVar1) && (iVar5 = iVar1, iVar2 = (**(code **)(*in_RDI + 0x90))(), iVar5 <= iVar2)) {
    this_01 = (TPZConnect *)(**(code **)(*in_RDI + 0xa8))(in_RDI,iVar1);
    this_04 = this_01;
    iVar2 = in_EDX;
    plVar4 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x12),(long)iVar1);
    TPZConnect::SetOrder(this_04,iVar2,*plVar4);
    nstate = (int)((ulong)this_04 >> 0x20);
    this_02 = (TPZBlock *)TPZConnect::SequenceNumber(this_01);
    b = 1;
    plVar4 = (long *)(**(code **)(*in_RDI + 0xb8))();
    if (plVar4 != (long *)0x0) {
      b = (**(code **)(*plVar4 + 0x78))();
    }
    pos = (int)((ulong)plVar4 >> 0x20);
    TPZConnect::SetNState((TPZConnect *)CONCAT44(iVar5,iVar2),nstate);
    iVar1 = (**(code **)(*in_RDI + 0x260))(in_RDI,iVar1,in_EDX);
    TPZConnect::SetNShape(this_01,iVar1);
    this_03 = TPZCompEl::Mesh(in_stack_00000190);
    TPZCompMesh::Block(this_03);
    TPZBlock::Set(this_02,b,in_stack_ffffffffffffffd0,pos);
    return;
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"TPZCompElHDiv::SetSideOrder. Bad paramenter side "
                          );
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_ESI);
  poVar3 = std::operator<<(poVar3," order ");
  this_00 = (void *)std::ostream::operator<<(poVar3,in_EDX);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void TPZCompElHDiv<TSHAPE>::SetSideOrder(int side, int order){
	int connectaux= SideConnectLocId(0,side);
	if(connectaux<0 || connectaux > this-> NConnects()) {
		PZError << "TPZCompElHDiv::SetSideOrder. Bad paramenter side " << side << " order " << order << std::endl;
#ifdef PZ_LOG
		std::stringstream sout;
		sout << __PRETTY_FUNCTION__ << " Bad side or order " << side << " order " << order;
		LOGPZ_DEBUG(logger,sout.str())
#endif
		return;
	}
	TPZConnect &c = this->Connect(connectaux);
    c.SetOrder(order,this->fConnectIndexes[connectaux]);
    int64_t seqnum = c.SequenceNumber();
    int nvar = 1;
    TPZMaterial * mat =this-> Material();
    if(mat) nvar = mat->NStateVariables();
    c.SetNState(nvar);
    int nshape =this->NConnectShapeF(connectaux,order);
    c.SetNShape(nshape);
	this-> Mesh()->Block().Set(seqnum,nshape*nvar);
}